

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall
DMessageBoxMenu::DMessageBoxMenu
          (DMessageBoxMenu *this,DMenu *parent,char *message,int messagemode,bool playsound,
          FName *action)

{
  FFont *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BYTE *pBVar5;
  
  DMenu::DMenu(&this->super_DMenu,parent);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006e8798;
  (this->mAction).Index = 0;
  (this->mAction).Index = action->Index;
  this->messageSelection = 0;
  this->mMouseLeft = 0x8c;
  this->mMouseY = -0x80000000;
  pFVar1 = SmallFont;
  pBVar5 = (BYTE *)FStringTable::operator[](&GStrings,"TXT_YES");
  iVar2 = FFont::StringWidth(pFVar1,pBVar5);
  pFVar1 = SmallFont;
  pBVar5 = (BYTE *)FStringTable::operator[](&GStrings,"TXT_NO");
  iVar3 = FFont::StringWidth(pFVar1,pBVar5);
  iVar4 = iVar3 + 0xaa;
  if (iVar3 + 0xaa < iVar2 + 0xaa) {
    iVar4 = iVar2 + 0xaa;
  }
  this->mMouseRight = iVar4;
  Init(this,parent,message,messagemode,playsound);
  return;
}

Assistant:

DMessageBoxMenu::DMessageBoxMenu(DMenu *parent, const char *message, int messagemode, bool playsound, FName action)
: DMenu(parent)
{
	mAction = action;
	messageSelection = 0;
	mMouseLeft = 140;
	mMouseY = INT_MIN;
	int mr1 = 170 + SmallFont->StringWidth(GStrings["TXT_YES"]);
	int mr2 = 170 + SmallFont->StringWidth(GStrings["TXT_NO"]);
	mMouseRight = MAX(mr1, mr2);

	Init(parent, message, messagemode, playsound);
}